

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::ShaderRenderCase::ShaderRenderCase
          (ShaderRenderCase *this,TestContext *testCtx,RenderContext *renderCtx,ContextInfo *ctxInfo
          ,char *name,char *description,bool isVertexCase,ShaderEvalFunc evalFunc)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_02152068;
  this->m_renderCtx = renderCtx;
  this->m_ctxInfo = ctxInfo;
  this->m_isVertexCase = isVertexCase;
  (this->m_defaultEvaluator)._vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_02152040;
  (this->m_defaultEvaluator).m_evalFunc = evalFunc;
  this->m_evaluator = &this->m_defaultEvaluator;
  (this->m_vertShaderSource)._M_dataplus._M_p = (pointer)&(this->m_vertShaderSource).field_2;
  (this->m_vertShaderSource)._M_string_length = 0;
  (this->m_vertShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_fragShaderSource)._M_dataplus._M_p = (pointer)&(this->m_fragShaderSource).field_2;
  (this->m_fragShaderSource)._M_string_length = 0;
  (this->m_fragShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_clearColor).m_data[0] = 0.0;
  (this->m_clearColor).m_data[1] = 0.0;
  (this->m_clearColor).m_data[2] = 0.0;
  (this->m_clearColor).m_data[3] = 1.0;
  (this->m_userAttribTransforms).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_userAttribTransforms).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_userAttribTransforms).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_textures).super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

ShaderRenderCase::ShaderRenderCase(TestContext& testCtx, RenderContext& renderCtx, const ContextInfo& ctxInfo,
								   const char* name, const char* description, bool isVertexCase,
								   ShaderEvalFunc evalFunc)
	: TestCase(testCtx, name, description)
	, m_renderCtx(renderCtx)
	, m_ctxInfo(ctxInfo)
	, m_isVertexCase(isVertexCase)
	, m_defaultEvaluator(evalFunc)
	, m_evaluator(m_defaultEvaluator)
	, m_clearColor(DEFAULT_CLEAR_COLOR)
	, m_program(DE_NULL)
{
}